

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

int If_CluCheckDecOut(word t,int nVars)

{
  int local_20;
  int v;
  int nVars_local;
  word t_local;
  
  local_20 = 0;
  while( true ) {
    if (nVars <= local_20) {
      return 0;
    }
    if (((((t & Truth6[local_20]) == 0) || (((t ^ 0xffffffffffffffff) & Truth6[local_20]) == 0)) ||
        ((t & (Truth6[local_20] ^ 0xffffffffffffffff)) == 0)) ||
       (((t ^ 0xffffffffffffffff) & (Truth6[local_20] ^ 0xffffffffffffffff)) == 0)) break;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

int If_CluCheckDecOut( word t, int nVars )
{
    int v;
    for ( v = 0; v < nVars; v++ )
        if ( 
             (t & Truth6[v]) == 0   ||  //  F * !a
             (~t & Truth6[v]) == 0  ||  // !F * !a
             (t & ~Truth6[v]) == 0  ||  //  F *  a
             (~t & ~Truth6[v]) == 0     // !F *  a   
           )
            return 1;
    return 0;
}